

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTestFixture.cpp
# Opt level: O1

void __thiscall
celero::ThreadTestFixture::startThreads
          (ThreadTestFixture *this,uint64_t threads,uint64_t iterations)

{
  element_type *peVar1;
  _Head_base<0UL,_celero::ThreadTestFixture::Impl_*,_false> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result_base *p_Var4;
  _State_baseV2 *__tmp;
  _func_int **pp_Var5;
  bool bVar6;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  __state_type local_88;
  long *local_78;
  ThreadTestFixture *local_70;
  undefined **local_68;
  ulong local_60;
  _func_int **local_58 [2];
  _func_int **local_48;
  __basic_future<void> local_40;
  
  local_60 = iterations / threads;
  local_48 = (_func_int **)(threads + (threads == 0));
  local_68 = &PTR__M_destroy_00146b18;
  pp_Var5 = (_func_int **)0x0;
  local_70 = this;
  do {
    this_00._M_head_impl =
         (local_70->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ThreadTestFixture::Impl,_std::default_delete<celero::ThreadTestFixture::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ThreadTestFixture::Impl_*,_std::default_delete<celero::ThreadTestFixture::Impl>_>
         .super__Head_base<0UL,_celero::ThreadTestFixture::Impl_*,_false>._M_head_impl;
    local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00146910;
    peVar1 = (element_type *)(p_Var3 + 1);
    p_Var3[2]._M_use_count = 0;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[3]._M_use_count = 0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00146960;
    p_Var4 = (_Result_base *)operator_new(0x10);
    *(undefined8 *)p_Var4 = 0;
    *(undefined8 *)(p_Var4 + 8) = 0;
    std::__future_base::_Result_base::_Result_base(p_Var4);
    *(undefined ***)p_Var4 = local_68;
    p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
    *(ThreadTestFixture **)&p_Var3[4]._M_use_count = local_70;
    p_Var3[5]._vptr__Sp_counted_base = pp_Var5;
    p_Var3[5]._M_use_count = (undefined4)local_60;
    p_Var3[5]._M_weak_count = local_60._4_4_;
    local_58[0] = (_func_int **)0x0;
    local_78 = (long *)operator_new(0x20);
    *local_78 = (long)&PTR___State_001469b8;
    local_78[1] = (long)peVar1;
    local_78[2] = (long)std::__future_base::
                        _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/ThreadTestFixture.cpp:58:36)>_>,_void>
                        ::_M_run;
    local_78[3] = 0;
    std::thread::_M_start_thread(local_58,&local_78,0);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
    _Var2._M_pi = local_88.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
      std::terminate();
    }
    p_Var3[3]._vptr__Sp_counted_base = local_58[0];
    bVar6 = local_88.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (bVar6) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001469f8;
      p_Var3[2]._M_use_count = 0;
      p_Var3[1]._M_use_count = 0;
      p_Var3[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00146a48;
      p_Var4 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var4 = 0;
      *(undefined8 *)(p_Var4 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var4);
      _Var2._M_pi = local_88.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      *(undefined ***)p_Var4 = local_68;
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)p_Var4;
      *(ThreadTestFixture **)&p_Var3[3]._M_use_count = local_70;
      p_Var3[4]._vptr__Sp_counted_base = pp_Var5;
      p_Var3[4]._M_use_count = (undefined4)local_60;
      p_Var3[4]._M_weak_count = local_60._4_4_;
      bVar6 = local_88.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var3 + 1);
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (bVar6) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
      }
    }
    std::__basic_future<void>::__basic_future(&local_40,&local_88);
    if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)this_00._M_head_impl,
               (future<void> *)&local_40);
    if (local_40._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pp_Var5 = (_func_int **)((long)pp_Var5 + 1);
  } while (local_48 != pp_Var5);
  return;
}

Assistant:

void ThreadTestFixture::startThreads(uint64_t threads, uint64_t iterations)
{
	const uint64_t iterationsPerThread = iterations / threads;

	for(uint64_t i = 0; i < threads; ++i)
	{
		try
		{
			this->pimpl->futures.push_back(
				// std::async(std::launch::deferred,
				std::async(std::launch::async, [this, i, iterationsPerThread]() {
					this->pimpl->currentThreadId = i + 1;
					for(auto threadIterationCounter = size_t(0); threadIterationCounter < iterationsPerThread;)
					{
						this->pimpl->currentCallId = ++threadIterationCounter;
						this->UserBenchmark();
					}
				}));
		}
		catch(std::system_error& e)
		{
			std::cerr << "ERROR: Exception. Error Code: " << e.code() << ", " << e.what() << std::endl;
		}
	}
}